

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O1

uint64_t __thiscall
adios2::core::engine::BP5Writer::WriteMetadata
          (BP5Writer *this,vector<char,_std::allocator<char>_> *ContigMetaData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *SizeVector,
          vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *AttributeBlocks)

{
  TransportMan *this_00;
  pointer puVar1;
  pointer puVar2;
  char *buffer;
  pointer piVar3;
  BP5Writer *pBVar4;
  long lVar5;
  unsigned_long *__args;
  iovec *b;
  pointer piVar6;
  pointer puVar7;
  size_t size;
  pointer pcVar8;
  ulong uVar9;
  size_t MDataTotalSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> AttrSizeVector;
  long local_b0;
  char *local_a8;
  iterator iStack_a0;
  unsigned_long *local_98;
  BP5Writer *local_88;
  vector<char,_std::allocator<char>_> *local_80;
  unsigned_long local_78;
  string local_70;
  string local_50;
  
  puVar2 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = 0;
  puVar1 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar7 = puVar1; puVar7 != puVar2; puVar7 = puVar7 + 1) {
    lVar5 = lVar5 + *puVar7;
  }
  local_a8 = (char *)0x0;
  iStack_a0._M_current = (unsigned_long *)0x0;
  local_98 = (unsigned_long *)0x0;
  local_b0 = (long)puVar2 + (lVar5 - (long)puVar1);
  local_88 = this;
  local_80 = ContigMetaData;
  if ((SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar5 = 8;
    uVar9 = 0;
    do {
      piVar6 = (AttributeBlocks->
               super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (uVar9 < (ulong)((long)(AttributeBlocks->
                                super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 4)) {
        __args = (unsigned_long *)((long)&piVar6->iov_base + lVar5);
        local_b0 = *(long *)((long)&piVar6->iov_base + lVar5) + local_b0 + 8;
        if (iStack_a0._M_current == local_98) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,iStack_a0,
                     __args);
        }
        else {
          *iStack_a0._M_current = *__args;
          iStack_a0._M_current = iStack_a0._M_current + 1;
        }
      }
      else {
        local_78 = 0;
        if (iStack_a0._M_current == local_98) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,iStack_a0,
                     &local_78);
        }
        else {
          *iStack_a0._M_current = 0;
          iStack_a0._M_current = iStack_a0._M_current + 1;
        }
        local_b0 = local_b0 + 8;
      }
      uVar9 = uVar9 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar9 < (ulong)((long)(SizeVector->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(SizeVector->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pBVar4 = local_88;
  this_00 = &local_88->m_FileMetadataManager;
  transportman::TransportMan::WriteFiles(this_00,(char *)&local_b0,8,-1);
  puVar1 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  transportman::TransportMan::WriteFiles
            (this_00,(char *)puVar1,
             (long)(SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,-1);
  size = (long)iStack_a0._M_current - (long)local_a8;
  transportman::TransportMan::WriteFiles(this_00,local_a8,size,-1);
  uVar9 = (long)iStack_a0._M_current + (size - (long)local_a8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MetadataBlockWrite","");
  profiling::JSONProfiler::Start(&pBVar4->m_Profiler,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  buffer = (local_80->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  transportman::TransportMan::WriteFiles
            (this_00,buffer,
             (long)(local_80->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)buffer,-1);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MetadataBlockWrite","");
  profiling::JSONProfiler::Stop(&pBVar4->m_Profiler,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pcVar8 = (local_80->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_finish +
           ((uVar9 & 0xfffffffffffffff8) -
           (long)(local_80->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start) + 8;
  piVar3 = (AttributeBlocks->
           super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar6 = (AttributeBlocks->
                super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>).
                _M_impl.super__Vector_impl_data._M_start; piVar6 != piVar3; piVar6 = piVar6 + 1) {
    if ((char *)piVar6->iov_base != (char *)0x0) {
      transportman::TransportMan::WriteFiles(this_00,(char *)piVar6->iov_base,piVar6->iov_len,-1);
      pcVar8 = pcVar8 + piVar6->iov_len;
    }
  }
  transportman::TransportMan::FlushFiles(this_00,-1);
  local_88->m_MetaDataPos = (uint64_t)(pcVar8 + local_88->m_MetaDataPos);
  if (local_a8 != (char *)0x0) {
    operator_delete(local_a8);
  }
  return (uint64_t)pcVar8;
}

Assistant:

uint64_t BP5Writer::WriteMetadata(const std::vector<char> &ContigMetaData,
                                  const std::vector<size_t> &SizeVector,
                                  const std::vector<core::iovec> &AttributeBlocks)
{
    size_t MDataTotalSize = std::accumulate(SizeVector.begin(), SizeVector.end(), size_t(0));
    uint64_t MetaDataSize = 0;
    std::vector<uint64_t> AttrSizeVector;

    MDataTotalSize += SizeVector.size() * sizeof(size_t);
    for (size_t a = 0; a < SizeVector.size(); a++)
    {
        if (a < AttributeBlocks.size())
        {
            auto &b = AttributeBlocks[a];
            MDataTotalSize += sizeof(uint64_t) + b.iov_len;
            AttrSizeVector.push_back(b.iov_len);
        }
        else
        {
            AttrSizeVector.push_back(0);
            MDataTotalSize += sizeof(uint64_t);
        }
    }
    MetaDataSize = 0;
    m_FileMetadataManager.WriteFiles((char *)&MDataTotalSize, sizeof(uint64_t));
    MetaDataSize += sizeof(uint64_t);
    m_FileMetadataManager.WriteFiles((char *)SizeVector.data(),
                                     sizeof(uint64_t) * SizeVector.size());
    MetaDataSize += sizeof(uint64_t) * AttrSizeVector.size();
    m_FileMetadataManager.WriteFiles((char *)AttrSizeVector.data(),
                                     sizeof(uint64_t) * AttrSizeVector.size());
    MetaDataSize += sizeof(uint64_t) * AttrSizeVector.size();
    m_Profiler.Start("MetadataBlockWrite");
    m_FileMetadataManager.WriteFiles(ContigMetaData.data(), ContigMetaData.size());
    m_Profiler.Stop("MetadataBlockWrite");
    MetaDataSize += ContigMetaData.size();

    for (auto &b : AttributeBlocks)
    {
        if (!b.iov_base)
            continue;
        m_FileMetadataManager.WriteFiles((char *)b.iov_base, b.iov_len);
        MetaDataSize += b.iov_len;
    }

    m_FileMetadataManager.FlushFiles();

    m_MetaDataPos += MetaDataSize;
    return MetaDataSize;
}